

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::FunctionCall::~FunctionCall(FunctionCall *this)

{
  ~FunctionCall(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

FunctionCall (CodeLocation l, pool_ptr<Expression> dest, pool_ptr<Function> f)
            : Assignment (std::move (l), dest), function (f)
        {
        }